

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

parser_error parser_parse(parser *p,char *line)

{
  uint uVar1;
  _Bool _Var2;
  int iVar3;
  parser_error pVar4;
  ushort **ppuVar5;
  char *__s;
  char *pcVar6;
  char *pcVar7;
  parser_value *p_00;
  long lVar8;
  ulong uVar9;
  parser_value *ppVar10;
  char *pcVar11;
  uint uVar12;
  wchar_t wVar13;
  parser_hook *ppVar14;
  int iVar15;
  ulong uVar16;
  parser_spec *ppVar17;
  char cVar18;
  char *z;
  undefined8 local_58;
  undefined8 uStack_50;
  parser_value *local_40;
  char *local_38;
  
  if (p == (parser *)0x0) {
    __assert_fail("p",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/parser.c"
                  ,0xda,"enum parser_error parser_parse(struct parser *, const char *)");
  }
  if (line == (char *)0x0) {
    __assert_fail("line",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/parser.c"
                  ,0xdb,"enum parser_error parser_parse(struct parser *, const char *)");
  }
  parser_freeold(p);
  p->lineno = p->lineno + 1;
  p->colno = 1;
  p->fhead = (parser_value *)0x0;
  p->ftail = (parser_value *)0x0;
  cVar18 = *line;
  if (cVar18 == '\0') {
    return PARSE_ERROR_NONE;
  }
  ppuVar5 = __ctype_b_loc();
  while ((*(byte *)((long)*ppuVar5 + (long)cVar18 * 2 + 1) & 0x20) != 0) {
    cVar18 = line[1];
    line = line + 1;
    if (cVar18 == '\0') {
      return PARSE_ERROR_NONE;
    }
  }
  if (cVar18 == '#') {
    return PARSE_ERROR_NONE;
  }
  __s = string_make(line);
  pcVar6 = strtok(__s,":");
  if (pcVar6 == (char *)0x0) {
    mem_free(__s);
    p->error = PARSE_ERROR_MISSING_FIELD;
    return PARSE_ERROR_MISSING_FIELD;
  }
  ppVar14 = (parser_hook *)&p->hooks;
  do {
    ppVar14 = ppVar14->next;
    if (ppVar14 == (parser_hook *)0x0) {
      my_strcpy(p->errmsg,pcVar6,0x400);
      p->error = PARSE_ERROR_UNDEFINED_DIRECTIVE;
      mem_free(__s);
      return PARSE_ERROR_UNDEFINED_DIRECTIVE;
    }
    iVar3 = strcmp(ppVar14->dir,pcVar6);
  } while (iVar3 != 0);
  ppVar17 = ppVar14->fhead;
  if (ppVar17 == (parser_spec *)0x0) {
LAB_0019d7e2:
    mem_free(__s);
    pVar4 = (*ppVar14->func)(p);
    p->error = pVar4;
    return pVar4;
  }
  pcVar6 = (char *)0x0;
LAB_0019d41d:
  uVar1 = ppVar17->type;
  uVar12 = uVar1 & 0xfffffffe;
  p->colno = p->colno + 1;
  if ((uVar1 < 0xc) && ((0xf3cU >> (uVar1 & 0x1f) & 1) != 0)) {
    pcVar7 = strtok(pcVar6,":");
LAB_0019d452:
    if (pcVar7 == (char *)0x0) goto LAB_0019d7b7;
    p_00 = (parser_value *)mem_alloc(0x28);
    (p_00->spec).next = (parser_spec *)0x0;
    (p_00->spec).type = ppVar17->type;
    (p_00->spec).name = ppVar17->name;
    if (uVar12 == 0xc) {
      pcVar6 = (char *)0x0;
      goto LAB_0019d509;
    }
    if (uVar12 == 10) {
      local_58 = (char *)0x0;
      uVar16 = strtoul(pcVar7,(char **)&local_58,0);
      (p_00->u).cval = (wchar_t)uVar16;
      if ((local_58 == pcVar7) || (*pcVar7 == '-')) {
LAB_0019d830:
        mem_free(p_00);
        mem_free(__s);
        my_strcpy(p->errmsg,ppVar17->name,0x400);
        p->error = PARSE_ERROR_NOT_NUMBER;
        return PARSE_ERROR_NOT_NUMBER;
      }
    }
    else if (uVar12 == 2) {
      local_58 = (char *)0x0;
      lVar8 = strtol(pcVar7,(char **)&local_58,0);
      (p_00->u).cval = (wchar_t)lVar8;
      if (local_58 == pcVar7) goto LAB_0019d830;
    }
    else if ((uVar1 & 0xfffffffc) == 4) {
      pcVar6 = string_make(pcVar7);
      (p_00->u).sval = pcVar6;
    }
    else if (uVar12 == 8) {
      local_58 = (char *)0x0;
      uStack_50 = 0;
      cVar18 = *pcVar7;
      pcVar7 = pcVar7 + (cVar18 == '-');
      iVar3 = 1;
      uVar16 = 0;
      local_40 = p_00;
      do {
        while( true ) {
          while( true ) {
            iVar15 = (int)uVar16;
            if (*pcVar7 != 'M') break;
            if (iVar15 == 2) goto LAB_0019d7ff;
            pcVar7 = pcVar7 + 1;
            iVar3 = 4;
            uVar16 = 3;
          }
          if (*pcVar7 != 'd') break;
          if (2 < iVar15) goto LAB_0019d7ff;
          if (iVar15 != 2) {
            local_58 = (char *)CONCAT44(1,(wchar_t)local_58);
          }
          pcVar7 = pcVar7 + 1;
          iVar3 = 3;
          uVar16 = 2;
        }
        uVar9 = strtoul(pcVar7,&local_38,10);
        if (local_38 == pcVar7) {
          _Var2 = contains_only_spaces(pcVar7);
          p_00 = local_40;
          if ((!_Var2) || (iVar15 < iVar3)) goto LAB_0019d7ff;
          wVar13 = (wchar_t)local_58;
          goto LAB_0019d720;
        }
        p_00 = local_40;
        if ((0x7fffffff < uVar9) || (*pcVar7 == '+')) goto LAB_0019d7ff;
        wVar13 = (wchar_t)uVar9;
        pcVar7 = local_38;
        if (iVar15 == 0) {
          uVar16 = 1;
          if (*local_38 != 'd') {
            if (*local_38 != '+') goto LAB_0019d761;
            pcVar7 = local_38 + 1;
            iVar3 = 3;
            uVar16 = 0;
          }
        }
        else if (iVar15 == 4) goto LAB_0019d7ff;
        *(wchar_t *)((long)&local_58 + uVar16 * 4) = wVar13;
        uVar16 = (ulong)((int)uVar16 + 1);
        p_00 = local_40;
      } while( true );
    }
    pcVar6 = (char *)0x0;
    goto LAB_0019d65b;
  }
  pcVar7 = strtok(pcVar6,"");
  if (uVar12 != 0xc) goto LAB_0019d452;
  if (pcVar7 != (char *)0x0) {
    pcVar11 = utf8_fskip(pcVar7,1,(char *)0x0);
    pcVar6 = (char *)0x0;
    if ((pcVar11 != (char *)0x0) && (pcVar6 = pcVar11, *pcVar11 != '\0')) {
      if (*pcVar11 != ':') {
        my_strcpy(p->errmsg,ppVar17->name,0x400);
        p->error = PARSE_ERROR_FIELD_TOO_LONG;
        mem_free(__s);
        return PARSE_ERROR_FIELD_TOO_LONG;
      }
      pcVar6 = pcVar11 + 1;
    }
    p_00 = (parser_value *)mem_alloc(0x28);
    (p_00->spec).next = (parser_spec *)0x0;
    (p_00->spec).type = ppVar17->type;
    (p_00->spec).name = ppVar17->name;
LAB_0019d509:
    text_mbstowcs(&(p_00->u).cval,pcVar7,L'\x01');
    goto LAB_0019d65b;
  }
LAB_0019d7b7:
  if ((ppVar17->type & 1) == 0) {
    my_strcpy(p->errmsg,ppVar17->name,0x400);
    p->error = PARSE_ERROR_MISSING_FIELD;
    mem_free(__s);
    return PARSE_ERROR_MISSING_FIELD;
  }
  goto LAB_0019d7e2;
LAB_0019d761:
  _Var2 = contains_only_spaces(local_38);
  p_00 = local_40;
  if (!_Var2) {
LAB_0019d7ff:
    mem_free(p_00);
    mem_free(__s);
    my_strcpy(p->errmsg,ppVar17->name,0x400);
    p->error = PARSE_ERROR_NOT_RANDOM;
    return PARSE_ERROR_NOT_RANDOM;
  }
LAB_0019d720:
  (local_40->u).cval = wVar13;
  (local_40->u).rval.dice = local_58._4_4_;
  (local_40->u).rval.sides = (wchar_t)uStack_50;
  (local_40->u).rval.m_bonus = uStack_50._4_4_;
  if (cVar18 == '-') {
    (local_40->u).cval = local_58._4_4_ * ~(wchar_t)uStack_50 - (wVar13 + uStack_50._4_4_);
  }
  pcVar6 = (char *)0x0;
  p_00 = local_40;
LAB_0019d65b:
  ppVar10 = (parser_value *)&p->fhead;
  if (p->fhead != (parser_value *)0x0) {
    ppVar10 = p->ftail;
  }
  (ppVar10->spec).next = &p_00->spec;
  p->ftail = p_00;
  ppVar17 = ppVar17->next;
  if (ppVar17 == (parser_spec *)0x0) goto LAB_0019d7e2;
  goto LAB_0019d41d;
}

Assistant:

enum parser_error parser_parse(struct parser *p, const char *line) {
	char *cline;
	char *tok;
	struct parser_hook *h;
	struct parser_spec *s;
	struct parser_value *v;
	char *sp = NULL;

	assert(p);
	assert(line);

	parser_freeold(p);

	p->lineno++;
	p->colno = 1;
	p->fhead = NULL;
	p->ftail = NULL;

	/* Ignore empty lines and comments. */
	while (*line && (isspace(*line)))
		line++;
	if (!*line || *line == '#')
		return PARSE_ERROR_NONE;

	cline = string_make(line);

	tok = strtok(cline, ":");
	if (!tok) {
		mem_free(cline);
		p->error = PARSE_ERROR_MISSING_FIELD;
		return PARSE_ERROR_MISSING_FIELD;
	}

	h = findhook(p, tok);
	if (!h) {
		my_strcpy(p->errmsg, tok, sizeof(p->errmsg));
		p->error = PARSE_ERROR_UNDEFINED_DIRECTIVE;
		mem_free(cline);
		return PARSE_ERROR_UNDEFINED_DIRECTIVE;
	}

	/* There's a little bit of trickiness here to account for optional
	 * types. The optional flag has a bit assigned to it in the spec's type
	 * tag; we compute a temporary type for the spec with that flag removed
	 * and use that instead. */
	for (s = h->fhead; s; s = s->next) {
		int t = s->type & ~PARSE_T_OPT;
		p->colno++;

		/* These types are tokenized on ':'; strings are not tokenized
		 * at all (i.e., they consume the remainder of the line) */
		if (t == PARSE_T_INT || t == PARSE_T_SYM || t == PARSE_T_RAND ||
			t == PARSE_T_UINT) {
			tok = strtok(sp, ":");
			sp = NULL;
		} else if (t == PARSE_T_CHAR) {
			tok = strtok(sp, "");
			if (tok) {
				sp = utf8_fskip(tok, 1, NULL);
				if (sp) {
					if (*sp == ':') {
						++sp;
					} else if (*sp) {
						my_strcpy(p->errmsg, s->name,
							sizeof(p->errmsg));
						p->error = PARSE_ERROR_FIELD_TOO_LONG;
						mem_free(cline);
						return PARSE_ERROR_FIELD_TOO_LONG;
					}
				}
			}
		} else {
			tok = strtok(sp, "");
			sp = NULL;
		}
		if (!tok) {
			if (!(s->type & PARSE_T_OPT)) {
				my_strcpy(p->errmsg, s->name, sizeof(p->errmsg));
				p->error = PARSE_ERROR_MISSING_FIELD;
				mem_free(cline);
				return PARSE_ERROR_MISSING_FIELD;
			}
			break;
		}

		/* Allocate a value node. */
		v = mem_alloc(sizeof *v);
		v->spec.next = NULL;
		v->spec.type = s->type;
		v->spec.name = s->name;

		/* Parse out its value. */
		if (t == PARSE_T_INT) {
			char *z = NULL;
			v->u.ival = strtol(tok, &z, 0);
			if (z == tok) {
				mem_free(v);
				mem_free(cline);
				my_strcpy(p->errmsg, s->name, sizeof(p->errmsg));
				p->error = PARSE_ERROR_NOT_NUMBER;
				return PARSE_ERROR_NOT_NUMBER;
			}
		} else if (t == PARSE_T_UINT) {
			char *z = NULL;
			v->u.uval = strtoul(tok, &z, 0);
			if (z == tok || *tok == '-') {
				mem_free(v);
				mem_free(cline);
				my_strcpy(p->errmsg, s->name, sizeof(p->errmsg));
				p->error = PARSE_ERROR_NOT_NUMBER;
				return PARSE_ERROR_NOT_NUMBER;
			}
		} else if (t == PARSE_T_CHAR) {
			text_mbstowcs(&v->u.cval, tok, 1);
		} else if (t == PARSE_T_SYM || t == PARSE_T_STR) {
			v->u.sval = string_make(tok);
		} else if (t == PARSE_T_RAND) {
			if (!parse_random(tok, &v->u.rval)) {
				mem_free(v);
				mem_free(cline);
				my_strcpy(p->errmsg, s->name, sizeof(p->errmsg));
				p->error = PARSE_ERROR_NOT_RANDOM;
				return PARSE_ERROR_NOT_RANDOM;
			}
		}

		/* Link it into the value list. */
		if (!p->fhead)
			p->fhead = v;
		else
			p->ftail->spec.next = &v->spec;
		p->ftail = v;
	}

	mem_free(cline);

	p->error = h->func(p);
	return p->error;
}